

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,VectorOfStrings *files)

{
  bool bVar1;
  ostream *this_00;
  char *msg;
  undefined1 local_470 [8];
  cmXMLWriter xml;
  string local_438 [32];
  undefined1 local_418 [8];
  ostringstream cmCTestLog_msg;
  allocator local_289;
  string local_288;
  undefined1 local_268 [8];
  cmGeneratedFileStream ofs;
  VectorOfStrings *files_local;
  cmCTest *this_local;
  
  ofs._576_8_ = files;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"Notes.xml",&local_289);
  bVar1 = OpenOutputFile(this,&this->CurrentTag,&local_288,(cmGeneratedFileStream *)local_268,false)
  ;
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    this_00 = std::operator<<((ostream *)local_418,"Cannot open notes file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
        ,0x684,msg,false);
    std::__cxx11::string::~string(local_438);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    xml._44_4_ = 1;
  }
  else {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_470,(ostream *)local_268,0);
    GenerateCTestNotesOutput(this,(cmXMLWriter *)local_470,(VectorOfStrings *)ofs._576_8_);
    xml._44_4_ = 1;
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_470);
  }
  this_local._4_4_ = (uint)bVar1;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  return this_local._4_4_;
}

Assistant:

int cmCTest::GenerateNotesFile(const VectorOfStrings &files)
{
  cmGeneratedFileStream ofs;
  if ( !this->OpenOutputFile(this->CurrentTag, "Notes.xml", ofs) )
    {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open notes file" << std::endl);
    return 1;
    }
  cmXMLWriter xml(ofs);
  this->GenerateCTestNotesOutput(xml, files);
  return 0;
}